

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

bool __thiscall setup::info::check_key(info *this,string *key)

{
  long lVar1;
  runtime_error *this_00;
  EVP_PKEY_CTX *ctx;
  checksum *other;
  checksum *this_01;
  long in_RDI;
  hasher checksum;
  char buffer [4];
  char nonce [24];
  xchacha20 cipher;
  char *in_stack_fffffffffffffe88;
  hasher *in_stack_fffffffffffffe90;
  int local_cc;
  undefined8 local_c8;
  ulong local_c0;
  undefined8 local_b8;
  xchacha20 local_a8;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x600) == 6) {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 != 0x38) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unexpected key size");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar1 = std::__cxx11::string::c_str();
    local_c8 = *(undefined8 *)(lVar1 + 0x20);
    local_b8 = *(undefined8 *)(lVar1 + 0x30);
    local_c0 = *(ulong *)(lVar1 + 0x28) ^ 0xffffffff;
    ctx = (EVP_PKEY_CTX *)std::__cxx11::string::c_str();
    crypto::xchacha20::init(&local_a8,ctx);
    memset(&local_cc,0,4);
    crypto::xchacha20::crypt(&local_a8,(char *)&local_cc,(char *)&local_cc);
    local_1 = local_cc == *(int *)(in_RDI + 0x5e0);
  }
  else {
    crypto::hasher::hasher
              (in_stack_fffffffffffffe90,(checksum_type)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    other = (checksum *)std::__cxx11::string::c_str();
    std::__cxx11::string::length();
    crypto::hasher::update(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(size_t)other);
    this_01 = (checksum *)std::__cxx11::string::c_str();
    std::__cxx11::string::length();
    crypto::hasher::update(in_stack_fffffffffffffe90,(char *)this_01,(size_t)other);
    crypto::hasher::finalize(in_stack_fffffffffffffe90);
    local_1 = crypto::checksum::operator==(this_01,other);
  }
  return local_1;
}

Assistant:

bool info::check_key(const std::string & key) {
	
	if(header.password.type == crypto::PBKDF2_SHA256_XChaCha20) {
		
		#if INNOEXTRACT_HAVE_DECRYPTION
		
		if(key.length() != crypto::xchacha20::key_size + crypto::xchacha20::nonce_size) {
			throw std::runtime_error("unexpected key size");
		}
		
		crypto::xchacha20 cipher;
		
		char nonce[crypto::xchacha20::nonce_size];
		std::memcpy(nonce, key.c_str() + crypto::xchacha20::key_size, crypto::xchacha20::nonce_size);
		*reinterpret_cast<boost::uint32_t *>(nonce + 8) = ~*reinterpret_cast<boost::uint32_t *>(nonce + 8);
		cipher.init(key.c_str(), nonce);
		
		char buffer[] = { 0, 0, 0, 0 };
		cipher.crypt(buffer, buffer, sizeof(buffer));
		
		return (std::memcmp(buffer, header.password.check, sizeof(buffer)) == 0);
		
		#else
		throw std::runtime_error("XChaCha20 decryption not supported in this build");
		#endif
		
	} else {
		
		crypto::hasher checksum(header.password.type);
		checksum.update(header.password_salt.c_str(), header.password_salt.length());
		checksum.update(key.c_str(), key.length());
		return (checksum.finalize() == header.password);
		
	}
	
}